

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

bool anon_unknown.dwarf_10919a6::TestPresetExecutionModeHelper
               (ModeEnum *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  String local_50;
  
  if (value == (Value *)0x0) {
    return true;
  }
  bVar1 = Json::Value::isString(value);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&local_50,value);
    bVar1 = std::operator==(&local_50,"until-fail");
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      *out = UntilFail;
      return true;
    }
    Json::Value::asString_abi_cxx11_(&local_50,value);
    bVar1 = std::operator==(&local_50,"until-pass");
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      *out = UntilPass;
      return true;
    }
    Json::Value::asString_abi_cxx11_(&local_50,value);
    bVar1 = std::operator==(&local_50,"after-timeout");
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      *out = AfterTimeout;
      return true;
    }
  }
  cmCMakePresetsErrors::INVALID_PRESET(value,state);
  return false;
}

Assistant:

bool TestPresetExecutionModeHelper(
  TestPreset::ExecutionOptions::RepeatOptions::ModeEnum& out,
  const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "until-fail") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::UntilFail;
    return true;
  }

  if (value->asString() == "until-pass") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::UntilPass;
    return true;
  }

  if (value->asString() == "after-timeout") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::AfterTimeout;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}